

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

void luaC_freeallobjects(lua_State *L)

{
  global_State *g_00;
  global_State *pgVar1;
  lua_State *plVar2;
  lua_State *plVar3;
  GCObject *pGVar4;
  lua_State *o;
  GCObject *o_00;
  global_State *g;
  
  g_00 = L->l_G;
  g_00->gcstp = '\x04';
  if (g_00->gckind != '\0') {
    enterinc(g_00);
  }
  g_00->lastatomic = 0;
  separatetobefnz(g_00,1);
  if (g_00->finobj != (GCObject *)0x0) {
    __assert_fail("g->finobj == ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                  ,0x646,"void luaC_freeallobjects(lua_State *)");
  }
  pgVar1 = L->l_G;
  while (pgVar1->tobefnz != (GCObject *)0x0) {
    GCTM(L);
  }
  plVar2 = g_00->mainthread;
  if (9 < (plVar2->tt & 0xe)) {
    __assert_fail("(((g->mainthread)->tt) & 0x0F) < (9+1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                  ,0x648,"void luaC_freeallobjects(lua_State *)");
  }
  o = (lua_State *)g_00->allgc;
  while (o != plVar2) {
    plVar3 = (lua_State *)o->next;
    freeobj(L,(GCObject *)o);
    o = plVar3;
  }
  if (g_00->finobj != (GCObject *)0x0) {
    __assert_fail("g->finobj == ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                  ,0x649,"void luaC_freeallobjects(lua_State *)");
  }
  o_00 = g_00->fixedgc;
  while (o_00 != (GCObject *)0x0) {
    pGVar4 = o_00->next;
    freeobj(L,o_00);
    o_00 = pGVar4;
  }
  if ((g_00->strt).nuse != 0) {
    __assert_fail("g->strt.nuse == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                  ,0x64b,"void luaC_freeallobjects(lua_State *)");
  }
  return;
}

Assistant:

void luaC_freeallobjects (lua_State *L) {
  global_State *g = G(L);
  g->gcstp = GCSTPCLS;  /* no extra finalizers after here */
  luaC_changemode(L, KGC_INC);
  separatetobefnz(g, 1);  /* separate all objects with finalizers */
  lua_assert(g->finobj == NULL);
  callallpendingfinalizers(L);
  deletelist(L, g->allgc, obj2gco(g->mainthread));
  lua_assert(g->finobj == NULL);  /* no new finalizers */
  deletelist(L, g->fixedgc, NULL);  /* collect fixed objects */
  lua_assert(g->strt.nuse == 0);
}